

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

void __thiscall CLI::App::_validate(App *this)

{
  pointer puVar1;
  Option *pOVar2;
  pointer puVar3;
  pointer pcVar4;
  pointer puVar5;
  InvalidError *this_00;
  ulong uVar6;
  App_p *app;
  pointer puVar7;
  ulong uVar8;
  string local_40;
  
  puVar5 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    uVar6 = 0;
    do {
      pOVar2 = (puVar5->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
               _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (pOVar2->expected_ == -1) {
        uVar8 = (ulong)((pOVar2->pname_)._M_string_length != 0);
      }
      else {
        uVar8 = 0;
      }
      uVar6 = uVar6 + uVar8;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
    if (1 < uVar6) {
      this_00 = (InvalidError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      pcVar4 = (this->name_)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar4,pcVar4 + (this->name_)._M_string_length);
      InvalidError::InvalidError(this_00,&local_40);
      __cxa_throw(this_00,&InvalidError::typeinfo,Error::~Error);
    }
  }
  puVar3 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (this->subcommands_).
                super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3; puVar7 = puVar7 + 1) {
    _validate((puVar7->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
              super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
              super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void _validate() const {
        auto count = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
            return opt->get_expected() == -1 && opt->get_positional();
        });
        if(count > 1)
            throw InvalidError(name_);
        for(const App_p &app : subcommands_)
            app->_validate();
    }